

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O3

void mf_repdata_do_replace(MF_REPLACEMENT_DATA_t *rd,size_t to_position)

{
  ulong uVar1;
  mf_replacement_nominee *pmVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  mf_replacement_nominee *pmVar7;
  bool bVar8;
  
  uVar1 = rd->trie->base_position;
  if (uVar1 <= to_position) {
    uVar4 = rd->noms_size;
    if (uVar4 != 0) {
      pmVar7 = rd->noms;
      sVar3 = pmVar7->position - (pmVar7->pattern->ptext).length;
      if (sVar3 < to_position) {
        uVar5 = 1;
        do {
          mf_repdata_appendfactor(rd,rd->curser,sVar3);
          mf_repdata_appendtext(rd,&pmVar7->pattern->rtext);
          rd->curser = pmVar7->position;
          uVar6 = (ulong)uVar5;
          uVar4 = rd->noms_size;
          if (uVar4 <= uVar6) break;
          pmVar2 = rd->noms;
          pmVar7 = pmVar2 + uVar6;
          sVar3 = pmVar2[uVar6].position - ((pmVar2[uVar6].pattern)->ptext).length;
          uVar5 = uVar5 + 1;
        } while (sVar3 < to_position);
        bVar8 = uVar6 != 0;
      }
      else {
        bVar8 = false;
        uVar6 = 0;
      }
      sVar3 = uVar4 - uVar6;
      rd->noms_size = sVar3;
      if (bVar8 && sVar3 != 0) {
        memcpy(rd->noms,rd->noms + uVar6,sVar3 * 0x10);
      }
    }
    uVar4 = rd->curser;
    if (uVar4 < to_position) {
      mf_repdata_appendfactor(rd,uVar4,to_position);
      rd->curser = to_position;
      uVar4 = to_position;
    }
    if (uVar1 <= uVar4) {
      (rd->backlog).length = 0;
    }
  }
  return;
}

Assistant:

static void mf_repdata_do_replace 
    (MF_REPLACEMENT_DATA_t *rd, size_t to_position)
{
    unsigned int index;
    struct mf_replacement_nominee *nom;
    size_t base_position = rd->trie->base_position;
    
    if (to_position < base_position)
        return;
    
    /* Replace the candidate patterns */
    if (rd->noms_size > 0)
    {
        for (index = 0; index < rd->noms_size; index++)
        {
            nom = &rd->noms[index];
            
            if (to_position <= (nom->position - nom->pattern->ptext.length))
                break;
            
            /* Append the space before pattern */
            mf_repdata_appendfactor (rd, rd->curser, /* from */
                    nom->position - nom->pattern->ptext.length /* to */);
            
            /* Append the replacement instead of the pattern */
            mf_repdata_appendtext(rd, &nom->pattern->rtext);
            
            rd->curser = nom->position;
        }
        rd->noms_size -= index;
        
        /* Shift the array to the left to eliminate the consumed nominees */
        if (rd->noms_size && index)
        {
            memcpy (&rd->noms[0], &rd->noms[index], 
                    rd->noms_size * sizeof(struct mf_replacement_nominee));
            /* TODO: implement a circular queue */
        }
    }
    
    /* Append the chunk between the last pattern and to_position */
    if (to_position > rd->curser)
    {
        mf_repdata_appendfactor (rd, rd->curser, to_position);
        
        rd->curser = to_position;
    }
    
    if (base_position <= rd->curser)
    {
        /* we consume the whole backlog or none of it */
        rd->backlog.length = 0;
    }
}